

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.cc
# Opt level: O1

MessageLite * __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::AddWeak
          (RepeatedPtrFieldBase *this,MessageLite *prototype)

{
  Rep *pRVar1;
  int iVar2;
  undefined4 extraout_var;
  ImplicitWeakMessage *pIVar3;
  
  pRVar1 = this->rep_;
  if (pRVar1 != (Rep *)0x0) {
    iVar2 = this->current_size_;
    if (iVar2 < pRVar1->allocated_size) {
      this->current_size_ = iVar2 + 1;
      return (MessageLite *)pRVar1->elements[iVar2];
    }
    if ((pRVar1 != (Rep *)0x0) && (pRVar1->allocated_size != this->total_size_)) goto LAB_00398606;
  }
  if (this->current_size_ <= this->total_size_) {
    InternalExtend(this,(this->total_size_ - this->current_size_) + 1);
  }
LAB_00398606:
  this->rep_->allocated_size = this->rep_->allocated_size + 1;
  if (prototype == (MessageLite *)0x0) {
    pIVar3 = Arena::CreateMessageInternal<google::protobuf::internal::ImplicitWeakMessage>
                       (this->arena_);
  }
  else {
    iVar2 = (*prototype->_vptr_MessageLite[3])(prototype);
    pIVar3 = (ImplicitWeakMessage *)CONCAT44(extraout_var,iVar2);
  }
  iVar2 = this->current_size_;
  this->current_size_ = iVar2 + 1;
  this->rep_->elements[iVar2] = pIVar3;
  return &pIVar3->super_MessageLite;
}

Assistant:

MessageLite* RepeatedPtrFieldBase::AddWeak(const MessageLite* prototype) {
  if (rep_ != nullptr && current_size_ < rep_->allocated_size) {
    return reinterpret_cast<MessageLite*>(rep_->elements[current_size_++]);
  }
  if (!rep_ || rep_->allocated_size == total_size_) {
    Reserve(total_size_ + 1);
  }
  ++rep_->allocated_size;
  MessageLite* result = prototype
                            ? prototype->New(arena_)
                            : Arena::CreateMessage<ImplicitWeakMessage>(arena_);
  rep_->elements[current_size_++] = result;
  return result;
}